

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

int prototypeArgument(int parBlkSize)

{
  typeDesc *ptVar1;
  typeDesc *ptVar2;
  object *poVar3;
  int local_30;
  int local_2c;
  int parSize;
  int tpIndex;
  typeDesc *tp;
  typeDesc *type;
  object *obj;
  int parBlkSize_local;
  
  local_2c = 0;
  if (((currentSymbol == 0x25f) || (currentSymbol == 0x261)) || (currentSymbol == 0x26d)) {
    if (currentSymbol == 0x25f) {
      local_2c = intTypeIndex;
    }
    else if (currentSymbol == 0x261) {
      local_2c = charTypeIndex;
    }
    else if (currentSymbol == 0x26d) {
      local_2c = boolTypeIndex;
    }
    getSymbol();
    if (currentSymbol == 0x1f5) {
      type = (typeDesc *)newObj(0x2c1);
      getSymbol();
    }
    else {
      type = (typeDesc *)newAnonymousObj(0x2c1);
    }
    type->len = local_2c;
    ptVar1 = getType(local_2c);
    local_30 = parBlkSize + ptVar1->size;
    if (currentSymbol == 0x130) {
      getSymbol();
      if (currentSymbol != 0x12f) {
        mark("missing right bracket");
        exit(-1);
      }
      ptVar1 = newType();
      ptVar1->form = 0x322;
      ptVar2 = getType(local_2c);
      ptVar1->base = ptVar2;
      ptVar1->size = 0xc;
      type->len = ptVar1->index;
      type->size = 0x2c5;
      local_30 = parBlkSize + 0xc;
      getSymbol();
    }
  }
  else {
    if (currentSymbol != 0x268) {
      mark("bad argument");
      exit(-1);
    }
    getSymbol();
    if (currentSymbol != 0x1f5) {
      mark("missing struct qualifier");
      exit(-1);
    }
    getSymbol();
    poVar3 = find();
    ptVar1 = getType(poVar3->typeIndex);
    if (currentSymbol != 99) {
      mark("bad struct variable");
      exit(-1);
    }
    getSymbol();
    if (currentSymbol == 0x1f5) {
      type = (typeDesc *)newObj(0x2c5);
      getSymbol();
    }
    else {
      type = (typeDesc *)newAnonymousObj(0x2c5);
    }
    type->len = ptVar1->refIndex;
    local_30 = parBlkSize + 4;
  }
  return local_30;
}

Assistant:

procedure 
int prototypeArgument(int parBlkSize)  {
	variable struct object *obj;
	variable struct typeDesc *type; variable struct typeDesc *tp;
	variable int tpIndex; variable int parSize;
	obj = NULL; tp = NULL; type = NULL; parSize = 0;tpIndex=0;

	if ((currentSymbol == SYMBOL_INT) || (currentSymbol == SYMBOL_CHAR) || (currentSymbol == SYMBOL_BOOL)) { /* int, char, bool */
		if (currentSymbol == SYMBOL_INT){
			tpIndex = intTypeIndex;
		} elsif (currentSymbol == SYMBOL_CHAR){
			tpIndex = charTypeIndex;
		} elsif (currentSymbol == SYMBOL_BOOL) {
			tpIndex = boolTypeIndex;
		}
		getSymbol();
		if (currentSymbol == SYMBOL_IDENTIFIER) {
			obj = newObj(CLASS_VAR);
			getSymbol();
		} else {
			obj = newAnonymousObj(CLASS_VAR); 
		}
		obj->typeIndex = tpIndex;
		type = getType(tpIndex);
		parSize = parBlkSize + type->size;
		if (currentSymbol == SYMBOL_LBRAK) { /* char [] */
			getSymbol();
			if (currentSymbol == SYMBOL_RBRAK) { 
				tp = newType();
				tp->form = FORM_ARRAY;
				type = getType(tpIndex);
				tp->base = type;
				tp->size = wordSize + 8; 
				obj->typeIndex = tp->index;
				obj->cl = CLASS_PAR; 
				parSize = parBlkSize + wordSize + 8; 
				getSymbol();
			} else {
				mark("missing right bracket");
				exit(-1);
			}
		}	
	} elsif (currentSymbol == SYMBOL_STRUCT) { 
		getSymbol();
		if (currentSymbol == SYMBOL_IDENTIFIER) {
			getSymbol();
			obj = find();
			type = getType(obj->typeIndex);
			if (currentSymbol == SYMBOL_MUL) {
				getSymbol();
				if (currentSymbol == SYMBOL_IDENTIFIER) {
					obj = newObj(CLASS_PAR);
					getSymbol();
				} else {
					obj = newAnonymousObj(CLASS_PAR);
				}
				obj->typeIndex = type->refIndex;
				parSize = parBlkSize + wordSize;
			} else {
				mark("bad struct variable");
				exit(-1);
			}
		} else {
			mark("missing struct qualifier");
			exit(-1);
		}
	} else {
		mark("bad argument");
		exit(-1);
	}
	return parSize;
}